

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.h
# Opt level: O3

void __thiscall
HashMap<TypeClass_*>::set_allocator(HashMap<TypeClass_*> *this,Allocator *newAllocator)

{
  if (this->entries != (Node **)0x0) {
    __assert_fail("entries == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/HashMap.h"
                  ,0x37,
                  "void HashMap<TypeClass *>::set_allocator(Allocator *) [Value = TypeClass *]");
  }
  this->allocator = newAllocator;
  if ((this->freeList).data == (this->freeList).little) {
    (this->freeList).allocator = newAllocator;
    return;
  }
  __assert_fail("data == little",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x13c,
                "void SmallArray<HashMap<TypeClass *>::Node *, 32>::set_allocator(Allocator *) [T = HashMap<TypeClass *>::Node *, N = 32]"
               );
}

Assistant:

void set_allocator(Allocator *newAllocator)
	{
		assert(entries == NULL);

		this->allocator = newAllocator;

		freeList.set_allocator(newAllocator);
	}